

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,InputPartData *part)

{
  int *in_RSI;
  Context *in_RDI;
  Context *in_stack_ffffffffffffffb8;
  Data *this_00;
  Context *__args;
  
  __args = in_RDI;
  Context::Context(in_RDI,in_stack_ffffffffffffffb8);
  this_00 = (Data *)(in_RDI + 1);
  std::make_shared<Imf_3_4::DeepScanLineInputFile::Data,Imf_3_4::Context*,int&,int&>
            ((Context **)__args,in_RSI,(int *)in_RDI);
  std::
  __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a4b2e);
  Data::initialize(this_00);
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (InputPartData* part)
    : _ctxt (part->context),
      _data (std::make_shared<Data> (&_ctxt, part->partNumber, part->numThreads))
{
    _data->initialize ();
}